

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::PickerPrivate::sizeHint(PickerPrivate *this,QStyleOption *opt)

{
  int iVar1;
  QArrayData *pQVar2;
  int iVar3;
  int iVar4;
  int extraout_var;
  QSize QVar5;
  int extraout_var_00;
  QByteArrayView QVar6;
  QArrayData *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  computeStringWidth(this);
  QVar6.m_data = (storage_type *)0x1;
  QVar6.m_size = (qsizetype)&local_30;
  QString::fromLatin1(QVar6);
  pQVar2 = local_30;
  uStack_20 = 0;
  local_28 = 0;
  local_30 = (QArrayData *)0x0;
  QFontMetrics::boundingRect((QString *)(opt + 0x20));
  this->stringHeight = (extraout_var_00 - extraout_var) + 1;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,8);
    }
  }
  this->itemTopMargin = this->stringHeight / 3;
  iVar3 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar3 * 3;
  iVar1 = this->maxStringWidth;
  iVar4 = QFontMetrics::averageCharWidth();
  QVar5.wd = iVar3 * 6 + iVar1 + iVar4 * 2;
  QVar5.ht = (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin;
  return QVar5;
}

Assistant:

QSize
PickerPrivate::sizeHint( const QStyleOption & opt )
{
	computeStringWidth();

	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemTopMargin = stringHeight / 3;

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	const int widgetWidth = maxStringWidth + 2 * itemSideMargin +
		2 * opt.fontMetrics.averageCharWidth();
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}